

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  code *pcVar9;
  bool bVar10;
  undefined4 *puVar11;
  ostringstream *poVar12;
  ulong uVar13;
  long lVar14;
  undefined4 *puVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  Array<float,_9> a;
  long *local_218;
  long local_208;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  int local_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ShaderMatrixCase *local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ostringstream local_1a8 [4];
  ostringstream aoStack_1a4 [4];
  ostringstream local_1a0 [4];
  ostringstream aoStack_19c [100];
  ios_base local_138 [264];
  long lVar7;
  
  local_1f4 = programID;
  local_1d0 = this;
  iVar6 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  puVar11 = &s_constInMat4;
  puVar18 = &s_constInMat3;
  lVar17 = 0;
  do {
    lVar16 = 0x128;
    if (lVar17 == 1) {
      lVar16 = 0x134;
    }
    if (*(int *)((long)&(local_1d0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                        _vptr_TestNode + lVar16) != 1) goto switchD_00ef9151_caseD_6;
    pcVar9 = *(code **)(lVar7 + 0xb48);
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"u_in","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,(int)lVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar13 = 0xf;
    if (local_1f0 != local_1e0) {
      uVar13 = local_1e0[0];
    }
    if (uVar13 < (ulong)(local_1c0 + local_1e8)) {
      uVar13 = 0xf;
      if (local_1c8 != local_1b8) {
        uVar13 = local_1b8[0];
      }
      if (uVar13 < (ulong)(local_1c0 + local_1e8)) goto LAB_00ef9063;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0);
    }
    else {
LAB_00ef9063:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1c8);
    }
    local_218 = &local_208;
    plVar1 = puVar8 + 2;
    if ((long *)*puVar8 == plVar1) {
      local_208 = *plVar1;
      uStack_200 = *(undefined4 *)(puVar8 + 3);
      uStack_1fc = *(undefined4 *)((long)puVar8 + 0x1c);
    }
    else {
      local_208 = *plVar1;
      local_218 = (long *)*puVar8;
    }
    *puVar8 = plVar1;
    puVar8[1] = 0;
    *(undefined1 *)plVar1 = 0;
    iVar6 = (*pcVar9)(local_1f4,local_218);
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (iVar6 < 0) goto switchD_00ef9151_caseD_6;
    switch(*(undefined4 *)
            ((long)&(local_1d0->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode
            + lVar16 + 4)) {
    case 1:
      (**(code **)(lVar7 + 0x14e0))((&deqp::gles3::Functional::s_constInFloat)[lVar17],iVar6);
      break;
    case 2:
      (**(code **)(lVar7 + 0x1528))(iVar6,1,&s_constInVec2 + lVar17 * 2);
      break;
    case 3:
      (**(code **)(lVar7 + 0x1568))(iVar6,1,(long)&s_constInVec3 + lVar17 * 0xc);
      break;
    case 4:
      (**(code **)(lVar7 + 0x15a8))(iVar6,1,s_constInVec4 + lVar17 * 0x10);
      break;
    case 5:
      pcVar9 = *(code **)(lVar7 + 0x15e0);
      lVar16 = 0;
      poVar12 = local_1a8;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        *(undefined8 *)poVar12 = *(undefined8 *)(&s_constInMat2 + lVar17 * 4 + lVar16 * 2);
        poVar12 = poVar12 + 8;
        lVar16 = 1;
        bVar5 = false;
      } while (bVar10);
      goto LAB_00ef92b8;
    case 9:
      pcVar9 = *(code **)(lVar7 + 0x1610);
      lVar16 = 0;
      poVar12 = local_1a8;
      puVar15 = puVar18;
      do {
        lVar14 = 0;
        do {
          *(undefined4 *)(poVar12 + lVar14) = *(undefined4 *)((long)puVar15 + lVar14);
          lVar14 = lVar14 + 4;
        } while (lVar14 != 0xc);
        lVar16 = lVar16 + 1;
        puVar15 = puVar15 + 3;
        poVar12 = poVar12 + 0xc;
      } while (lVar16 != 3);
      goto LAB_00ef92b8;
    case 0xd:
      pcVar9 = *(code **)(lVar7 + 0x1640);
      lVar16 = 0;
      do {
        puVar15 = (undefined4 *)((long)puVar11 + lVar16);
        uVar2 = puVar15[1];
        uVar3 = puVar15[2];
        uVar4 = puVar15[3];
        *(undefined4 *)(local_1a8 + lVar16) = *puVar15;
        *(undefined4 *)(local_1a8 + lVar16 + 4) = uVar2;
        *(undefined4 *)(aoStack_1a4 + lVar16 + 4) = uVar3;
        *(undefined4 *)(aoStack_1a4 + lVar16 + 8) = uVar4;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x40);
LAB_00ef92b8:
      (*pcVar9)(iVar6,1,0,local_1a8);
    }
switchD_00ef9151_caseD_6:
    lVar17 = lVar17 + 1;
    puVar11 = puVar11 + 0x10;
    puVar18 = puVar18 + 9;
    if (lVar17 == 2) {
      return;
    }
  } while( true );
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);													break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());										break;
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, s_constInMat2[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, s_constInMat3[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, s_constInMat4[inNdx].getColumnMajorData().getPtr());	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}